

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O0

Gia_Man_t * Gia_ManFromIfAig(If_Man_t *pIfMan)

{
  int iVar1;
  int c;
  Gia_Man_t *p;
  Vec_Int_t *vAig_00;
  Vec_Int_t *p_00;
  If_Obj_t *pObj;
  If_Cut_t *pCut;
  If_Obj_t *pIVar2;
  Gia_Man_t *pGVar3;
  bool bVar4;
  int local_58;
  int local_54;
  int k;
  int i;
  Vec_Int_t *vAig;
  Vec_Int_t *vLeaves;
  If_Cut_t *pCutBest;
  If_Obj_t *pIfLeaf;
  If_Obj_t *pIfObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  int fHash;
  If_Man_t *pIfMan_local;
  
  if (pIfMan->pPars->pLutStruct != (char *)0x0) {
    __assert_fail("pIfMan->pPars->pLutStruct == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                  ,0x398,"Gia_Man_t *Gia_ManFromIfAig(If_Man_t *)");
  }
  if ((((pIfMan->pPars->fDelayOpt == 0) && (pIfMan->pPars->fDsdBalance == 0)) &&
      (pIfMan->pPars->fUserRecLib == 0)) && (pIfMan->pPars->fUserSesLib == 0)) {
    __assert_fail("pIfMan->pPars->fDelayOpt || pIfMan->pPars->fDsdBalance || pIfMan->pPars->fUserRecLib || pIfMan->pPars->fUserSesLib"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                  ,0x399,"Gia_Man_t *Gia_ManFromIfAig(If_Man_t *)");
  }
  iVar1 = If_ManObjNum(pIfMan);
  p = Gia_ManStart(iVar1);
  Gia_ManHashAlloc(p);
  vAig_00 = Vec_IntAlloc(0x10000);
  p_00 = Vec_IntAlloc(0x10);
  local_54 = 0;
  do {
    iVar1 = Vec_PtrSize(pIfMan->vObjs);
    if (iVar1 <= local_54) {
      Vec_IntFree(vAig_00);
      Vec_IntFree(p_00);
      pGVar3 = Gia_ManRehash(p,0);
      Gia_ManStop(p);
      return pGVar3;
    }
    pObj = (If_Obj_t *)Vec_PtrEntry(pIfMan->vObjs,local_54);
    if ((pObj->nRefs != 0) || (iVar1 = If_ObjIsTerm(pObj), iVar1 != 0)) {
      iVar1 = If_ObjIsAnd(pObj);
      if (iVar1 == 0) {
        iVar1 = If_ObjIsCi(pObj);
        if (iVar1 == 0) {
          iVar1 = If_ObjIsCo(pObj);
          if (iVar1 == 0) {
            iVar1 = If_ObjIsConst1(pObj);
            if (iVar1 == 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                            ,0x3c2,"Gia_Man_t *Gia_ManFromIfAig(If_Man_t *)");
            }
            (pObj->field_22).iCopy = 1;
          }
          else {
            pIVar2 = If_ObjFanin0(pObj);
            iVar1 = (pIVar2->field_22).iCopy;
            c = If_ObjFaninC0(pObj);
            iVar1 = Abc_LitNotCond(iVar1,c);
            iVar1 = Gia_ManAppendCo(p,iVar1);
            (pObj->field_22).iCopy = iVar1;
          }
        }
        else {
          iVar1 = Gia_ManAppendCi(p);
          (pObj->field_22).iCopy = iVar1;
        }
      }
      else {
        pCut = If_ObjCutBest(pObj);
        Vec_IntClear(p_00);
        local_58 = 0;
        while( true ) {
          bVar4 = false;
          if (local_58 < (int)(*(uint *)&pCut->field_0x1c >> 0x18)) {
            pCutBest = (If_Cut_t *)If_ManObj(pIfMan,(int)(&pCut[1].Area)[local_58]);
            bVar4 = (If_Obj_t *)pCutBest != (If_Obj_t *)0x0;
          }
          if (!bVar4) break;
          Vec_IntPush(p_00,(int)pCutBest[2].Area);
          local_58 = local_58 + 1;
        }
        if (pIfMan->pPars->fDelayOpt == 0) {
          if (pIfMan->pPars->fDsdBalance == 0) {
            if (pIfMan->pPars->fUserRecLib == 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                            ,0x3ba,"Gia_Man_t *Gia_ManFromIfAig(If_Man_t *)");
            }
            iVar1 = Abc_RecToGia3(p,pIfMan,pCut,p_00,0);
            (pObj->field_22).iCopy = iVar1;
          }
          else {
            iVar1 = Gia_ManBuildFromMini(p,pIfMan,pCut,p_00,vAig_00,0,1);
            (pObj->field_22).iCopy = iVar1;
          }
        }
        else {
          iVar1 = Gia_ManBuildFromMini(p,pIfMan,pCut,p_00,vAig_00,0,0);
          (pObj->field_22).iCopy = iVar1;
        }
      }
    }
    local_54 = local_54 + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManFromIfAig( If_Man_t * pIfMan )
{
    int fHash = 0;
    Gia_Man_t * pNew, * pTemp;
    If_Obj_t * pIfObj, * pIfLeaf;
    If_Cut_t * pCutBest;
    Vec_Int_t * vLeaves;
    Vec_Int_t * vAig;
    int i, k;
    assert( pIfMan->pPars->pLutStruct == NULL );
    assert( pIfMan->pPars->fDelayOpt || pIfMan->pPars->fDsdBalance || pIfMan->pPars->fUserRecLib || pIfMan->pPars->fUserSesLib );
    // create new manager
    pNew = Gia_ManStart( If_ManObjNum(pIfMan) );
    Gia_ManHashAlloc( pNew );
    // iterate through nodes used in the mapping
    vAig = Vec_IntAlloc( 1 << 16 );
    vLeaves = Vec_IntAlloc( 16 );
//    If_ManForEachObj( pIfMan, pIfObj, i )
//        pIfObj->iCopy = 0;
    If_ManForEachObj( pIfMan, pIfObj, i )
    {
        if ( pIfObj->nRefs == 0 && !If_ObjIsTerm(pIfObj) )
            continue;
        if ( If_ObjIsAnd(pIfObj) )
        {
            pCutBest = If_ObjCutBest( pIfObj );
            // if the cut does not offer delay improvement
//            if ( (int)pIfObj->Level <= (int)pCutBest->Delay )
//            {
//                Gia_ManFromIfAig_rec( pNew, pIfMan, pIfObj );
//                continue;
//            }
            // collect leaves of the best cut
            Vec_IntClear( vLeaves );
            If_CutForEachLeaf( pIfMan, pCutBest, pIfLeaf, k )
                Vec_IntPush( vLeaves, pIfLeaf->iCopy );
            // get the functionality
            if ( pIfMan->pPars->fDelayOpt )
                pIfObj->iCopy = Gia_ManBuildFromMini( pNew, pIfMan, pCutBest, vLeaves, vAig, fHash, 0 );
            else if ( pIfMan->pPars->fDsdBalance )
                pIfObj->iCopy = Gia_ManBuildFromMini( pNew, pIfMan, pCutBest, vLeaves, vAig, fHash, 1 );
            else if ( pIfMan->pPars->fUserRecLib )
                pIfObj->iCopy = Abc_RecToGia3( pNew, pIfMan, pCutBest, vLeaves, fHash );
            else assert( 0 );
        }
        else if ( If_ObjIsCi(pIfObj) )
            pIfObj->iCopy = Gia_ManAppendCi(pNew);
        else if ( If_ObjIsCo(pIfObj) )
            pIfObj->iCopy = Gia_ManAppendCo( pNew, Abc_LitNotCond(If_ObjFanin0(pIfObj)->iCopy, If_ObjFaninC0(pIfObj)) );
        else if ( If_ObjIsConst1(pIfObj) )
            pIfObj->iCopy = 1;
        else assert( 0 );
    }
    Vec_IntFree( vAig );
    Vec_IntFree( vLeaves );
    pNew = Gia_ManRehash( pTemp = pNew, 0 );
    Gia_ManStop( pTemp );
    return pNew;
}